

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

int x509_name_ex_i2d(ASN1_VALUE **val,uchar **out,ASN1_ITEM *it)

{
  X509_NAME *a_00;
  int iVar1;
  int ret;
  X509_NAME *a;
  ASN1_ITEM *it_local;
  uchar **out_local;
  ASN1_VALUE **val_local;
  
  a_00 = (X509_NAME *)*val;
  if ((a_00->modified == 0) ||
     ((iVar1 = x509_name_encode(a_00), iVar1 != 0 && (iVar1 = x509_name_canon(a_00), iVar1 != 0))))
  {
    val_local._4_4_ = (int)a_00->bytes->length;
    if (out != (uchar **)0x0) {
      OPENSSL_memcpy(*out,a_00->bytes->data,(long)val_local._4_4_);
      *out = *out + val_local._4_4_;
    }
  }
  else {
    val_local._4_4_ = -1;
  }
  return val_local._4_4_;
}

Assistant:

static int x509_name_ex_i2d(ASN1_VALUE **val, unsigned char **out,
                            const ASN1_ITEM *it) {
  X509_NAME *a = (X509_NAME *)*val;
  if (a->modified && (!x509_name_encode(a) || !x509_name_canon(a))) {
    return -1;
  }
  int ret = a->bytes->length;
  if (out != NULL) {
    OPENSSL_memcpy(*out, a->bytes->data, ret);
    *out += ret;
  }
  return ret;
}